

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void assign_big_endian(uchar *ptr,size_t ptrlen,uint32_t val)

{
  int iVar1;
  size_t sVar2;
  uchar uVar3;
  
  iVar1 = (int)ptrlen;
  for (sVar2 = 0; iVar1 = iVar1 + -1, sVar2 != ptrlen; sVar2 = sVar2 + 1) {
    uVar3 = (uchar)(val >> ((byte)iVar1 & 0x1f));
    if (3 < iVar1) {
      uVar3 = '\0';
    }
    ptr[sVar2] = uVar3;
  }
  return;
}

Assistant:

static void assign_big_endian(unsigned char *ptr, size_t ptrlen, uint32_t val) {
    size_t i;
    for (i = 0; i < ptrlen; i++) {
        int shift = ptrlen - 1 - i;
        if (shift >= 4) {
            ptr[i] = 0;
        } else {
            ptr[i] = (val >> shift) & 0xFF;
        }
    }
}